

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimeMatcher::set
          (DateTimeMatcher *this,UnicodeString *pattern,FormatParser *fp,PtnSkeleton *skeletonResult
          )

{
  UBool UVar1;
  UChar UVar2;
  int32_t iVar3;
  int32_t iVar4;
  long lVar5;
  short local_9e;
  int16_t subField;
  int32_t repeatCount;
  UChar repeatChar;
  int32_t field;
  dtTypeElem *row;
  int32_t canonicalIndex;
  undefined1 local_78 [8];
  UnicodeString quoteLiteral;
  UnicodeString *value;
  PtnSkeleton *pPStack_28;
  int32_t i;
  PtnSkeleton *skeletonResult_local;
  FormatParser *fp_local;
  UnicodeString *pattern_local;
  DateTimeMatcher *this_local;
  
  for (value._4_4_ = 0; value._4_4_ < 0x10; value._4_4_ = value._4_4_ + 1) {
    skeletonResult->type[value._4_4_] = 0;
  }
  pPStack_28 = skeletonResult;
  skeletonResult_local = (PtnSkeleton *)fp;
  fp_local = (FormatParser *)pattern;
  pattern_local = (UnicodeString *)this;
  SkeletonFields::clear(&skeletonResult->original);
  SkeletonFields::clear(&pPStack_28->baseOriginal);
  pPStack_28->addedDefaultDayPeriod = '\0';
  FormatParser::set((FormatParser *)skeletonResult_local,(UnicodeString *)fp_local);
  for (value._4_4_ = 0; value._4_4_ < skeletonResult_local[0x16].type[8];
      value._4_4_ = value._4_4_ + 1) {
    quoteLiteral.fUnion._48_8_ = skeletonResult_local->type + (long)value._4_4_ * 0x10;
    UVar1 = FormatParser::isQuoteLiteral((UnicodeString *)quoteLiteral.fUnion._48_8_);
    if (UVar1 == '\0') {
      iVar3 = FormatParser::getCanonicalIndex((UnicodeString *)quoteLiteral.fUnion._48_8_);
      if (-1 < iVar3) {
        lVar5 = (long)iVar3 * 0x10;
        iVar3 = *(int32_t *)(dtTypes + lVar5 + 4);
        SkeletonFields::populate
                  (&pPStack_28->original,iVar3,(UnicodeString *)quoteLiteral.fUnion._48_8_);
        SkeletonFields::populate
                  (&pPStack_28->baseOriginal,iVar3,*(UChar *)(dtTypes + lVar5),
                   (int)*(short *)(dtTypes + lVar5 + 10));
        local_9e = *(short *)(dtTypes + lVar5 + 8);
        if (0 < *(short *)(dtTypes + lVar5 + 8)) {
          iVar4 = icu_63::UnicodeString::length((UnicodeString *)quoteLiteral.fUnion._48_8_);
          local_9e = local_9e + (short)iVar4;
        }
        pPStack_28->type[iVar3] = (int)local_9e;
      }
    }
    else {
      icu_63::UnicodeString::UnicodeString((UnicodeString *)local_78);
      FormatParser::getQuoteLiteral
                ((FormatParser *)skeletonResult_local,(UnicodeString *)local_78,
                 (int32_t *)((long)&value + 4));
      icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_78);
    }
  }
  UVar1 = SkeletonFields::isFieldEmpty(&pPStack_28->original,0xb);
  if (UVar1 == '\0') {
    UVar2 = SkeletonFields::getFieldChar(&pPStack_28->original,0xb);
    if ((UVar2 == L'h') ||
       (UVar2 = SkeletonFields::getFieldChar(&pPStack_28->original,0xb), UVar2 == L'K')) {
      UVar1 = SkeletonFields::isFieldEmpty(&pPStack_28->original,10);
      if (UVar1 != '\0') {
        value._4_4_ = 0;
        while (*(short *)(dtTypes + (long)value._4_4_ * 0x10) != 0) {
          if (*(int *)(dtTypes + (long)value._4_4_ * 0x10 + 4) == 10) {
            SkeletonFields::populate
                      (&pPStack_28->original,10,*(UChar *)(dtTypes + (long)value._4_4_ * 0x10),
                       (int)*(short *)(dtTypes + (long)value._4_4_ * 0x10 + 10));
            SkeletonFields::populate
                      (&pPStack_28->baseOriginal,10,*(UChar *)(dtTypes + (long)value._4_4_ * 0x10),
                       (int)*(short *)(dtTypes + (long)value._4_4_ * 0x10 + 10));
            pPStack_28->type[10] = (int)*(short *)(dtTypes + (long)value._4_4_ * 0x10 + 8);
            pPStack_28->addedDefaultDayPeriod = '\x01';
            break;
          }
          value._4_4_ = value._4_4_ + 1;
        }
      }
    }
    else {
      SkeletonFields::clearField(&pPStack_28->original,10);
      SkeletonFields::clearField(&pPStack_28->baseOriginal,10);
      pPStack_28->type[10] = 0;
    }
  }
  copyFrom(this,pPStack_28);
  return;
}

Assistant:

void
DateTimeMatcher::set(const UnicodeString& pattern, FormatParser* fp, PtnSkeleton& skeletonResult) {
    int32_t i;
    for (i=0; i<UDATPG_FIELD_COUNT; ++i) {
        skeletonResult.type[i] = NONE;
    }
    skeletonResult.original.clear();
    skeletonResult.baseOriginal.clear();
    skeletonResult.addedDefaultDayPeriod = FALSE;

    fp->set(pattern);
    for (i=0; i < fp->itemNumber; i++) {
        const UnicodeString& value = fp->items[i];
        // don't skip 'a' anymore, dayPeriod handled specially below

        if ( fp->isQuoteLiteral(value) ) {
            UnicodeString quoteLiteral;
            fp->getQuoteLiteral(quoteLiteral, &i);
            continue;
        }
        int32_t canonicalIndex = fp->getCanonicalIndex(value);
        if (canonicalIndex < 0) {
            continue;
        }
        const dtTypeElem *row = &dtTypes[canonicalIndex];
        int32_t field = row->field;
        skeletonResult.original.populate(field, value);
        UChar repeatChar = row->patternChar;
        int32_t repeatCount = row->minLen;
        skeletonResult.baseOriginal.populate(field, repeatChar, repeatCount);
        int16_t subField = row->type;
        if (row->type > 0) {
            U_ASSERT(value.length() < INT16_MAX);
            subField += static_cast<int16_t>(value.length());
        }
        skeletonResult.type[field] = subField;
    }
    // #13183, handle special behavior for day period characters (a, b, B)
    if (!skeletonResult.original.isFieldEmpty(UDATPG_HOUR_FIELD)) {
        if (skeletonResult.original.getFieldChar(UDATPG_HOUR_FIELD)==LOW_H || skeletonResult.original.getFieldChar(UDATPG_HOUR_FIELD)==CAP_K) {
            // We have a skeleton with 12-hour-cycle format
            if (skeletonResult.original.isFieldEmpty(UDATPG_DAYPERIOD_FIELD)) {
                // But we do not have a day period in the skeleton; add the default DAYPERIOD (currently "a")
                for (i = 0; dtTypes[i].patternChar != 0; i++) {
                    if ( dtTypes[i].field == UDATPG_DAYPERIOD_FIELD ) {
                        // first entry for UDATPG_DAYPERIOD_FIELD
                        skeletonResult.original.populate(UDATPG_DAYPERIOD_FIELD, dtTypes[i].patternChar, dtTypes[i].minLen);
                        skeletonResult.baseOriginal.populate(UDATPG_DAYPERIOD_FIELD, dtTypes[i].patternChar, dtTypes[i].minLen);
                        skeletonResult.type[UDATPG_DAYPERIOD_FIELD] = dtTypes[i].type;
                        skeletonResult.addedDefaultDayPeriod = TRUE;
                        break;
                    }
                }
            }
        } else {
            // Skeleton has 24-hour-cycle hour format and has dayPeriod, delete dayPeriod (i.e. ignore it)
            skeletonResult.original.clearField(UDATPG_DAYPERIOD_FIELD);
            skeletonResult.baseOriginal.clearField(UDATPG_DAYPERIOD_FIELD);
            skeletonResult.type[UDATPG_DAYPERIOD_FIELD] = NONE;
        }
    }
    copyFrom(skeletonResult);
}